

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

string * __thiscall
JetHead::Path::fileBasename_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  ulong uVar1;
  undefined1 local_38 [4];
  uint pos;
  string f;
  Path *this_local;
  
  f.field_2._8_8_ = this;
  filename_abi_cxx11_((string *)local_38,this);
  uVar1 = std::__cxx11::string::rfind((char *)local_38,0x139b3f);
  if ((uVar1 & 0xffffffff) == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string Path::fileBasename()
{
	string f = filename();
	unsigned pos = f.rfind( "." );

	if ( pos == string::npos )
	{
		return f;
	}
	else
	{
		return f.substr( 0, pos );
	}
}